

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::BasicSharedStruct::Run(BasicSharedStruct *this)

{
  bool bVar1;
  GLuint GVar2;
  bool *compile_error;
  long lVar3;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "\nlayout(local_size_x = 128) in;\nlayout(std430) buffer Output {\n  vec4 g_output[256];\n};\nstruct SubData {\n  mat2x4 data;\n};\nstruct Data {\n  uint index;\n  vec3 data0;\n  SubData data1;\n};\nshared Data g_shared_data[256];\nshared int g_shared_buf[2];\nvoid main() {\n  if (gl_LocalInvocationID.x == 0u) {\n    g_shared_buf[1] = 1;\n    g_shared_buf[1u + gl_LocalInvocationID.x] = 0;\n    g_shared_buf[0] = 128;\n    g_output[0] = vec4(g_shared_buf[1]);\n    g_output[128] = vec4(g_shared_buf[0]);\n    memoryBarrierBuffer();\n  } else {\n    uint index = gl_LocalInvocationIndex;\n    g_shared_data[index].index = index;\n    g_shared_data[index + 128u].index = index + 128u;\n    g_shared_data[index].data1.data = mat2x4(0.0);\n    g_shared_data[index + 128u].data1.data = mat2x4(0.0);\n    g_output[index] = vec4(g_shared_data[index].index);\n    g_output[index + 128u] = vec4(g_shared_data[index + 128u].index);\n    memoryBarrierShared();\n  }\n  memoryBarrierAtomicCounter();\n  memoryBarrierImage();\n  memoryBarrier();\n}"
             ,"");
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_38);
  this->m_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar3 = -1;
  if (bVar1) {
    bVar1 = RunIteration(this,false);
    if (bVar1) {
      bVar1 = RunIteration(this,true);
      lVar3 = (ulong)bVar1 - 1;
    }
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs = NL
			"layout(local_size_x = 128) in;" NL "layout(std430) buffer Output {" NL "  vec4 g_output[256];" NL "};" NL
			"struct SubData {" NL "  mat2x4 data;" NL "};" NL "struct Data {" NL "  uint index;" NL "  vec3 data0;" NL
			"  SubData data1;" NL "};" NL "shared Data g_shared_data[256];" NL "shared int g_shared_buf[2];" NL
			"void main() {" NL "  if (gl_LocalInvocationID.x == 0u) {" NL "    g_shared_buf[1] = 1;" NL
			"    g_shared_buf[1u + gl_LocalInvocationID.x] = 0;" NL "    g_shared_buf[0] = 128;" NL
			"    g_output[0] = vec4(g_shared_buf[1]);" NL "    g_output[128] = vec4(g_shared_buf[0]);" NL
			"    memoryBarrierBuffer();" // note: this call is not needed here, just check if compiler accepts it
			NL "  } else {" NL "    uint index = gl_LocalInvocationIndex;" NL
			"    g_shared_data[index].index = index;" NL "    g_shared_data[index + 128u].index = index + 128u;" NL
			"    g_shared_data[index].data1.data = mat2x4(0.0);" NL
			"    g_shared_data[index + 128u].data1.data = mat2x4(0.0);" NL
			"    g_output[index] = vec4(g_shared_data[index].index);" // load data from shared memory
			NL "    g_output[index + 128u] = vec4(g_shared_data[index + 128u].index);" NL
			"    memoryBarrierShared();" // note: this call is not needed here, just check if compiler accepts it
			NL "  }" NL "  memoryBarrierAtomicCounter();" NL "  memoryBarrierImage();" NL
			"  memoryBarrier();" // note: these calls are not needed here, just check if compiler accepts them
			NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		if (!RunIteration(false))
			return ERROR;
		if (!RunIteration(true))
			return ERROR;
		return NO_ERROR;
	}